

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.hpp
# Opt level: O2

string * __thiscall
duckdb::RemoveColumnInfo::GetColumnName_abi_cxx11_
          (string *__return_storage_ptr__,RemoveColumnInfo *this)

{
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->removed_column);
  return __return_storage_ptr__;
}

Assistant:

string GetColumnName() const override {
		return removed_column;
	}